

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O0

Enum * __thiscall
flatbuffers::BaseBfbsGenerator::GetEnumByIndex(BaseBfbsGenerator *this,int32_t index)

{
  uint uVar1;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *pVVar2;
  return_type pEVar3;
  int32_t index_local;
  BaseBfbsGenerator *this_local;
  
  if ((this->schema_ != (Schema *)0x0) && (-1 < index)) {
    pVVar2 = reflection::Schema::enums(this->schema_);
    uVar1 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::size(pVVar2);
    if (index < (int)uVar1) {
      pVVar2 = reflection::Schema::enums(this->schema_);
      pEVar3 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(pVVar2,index);
      return pEVar3;
    }
  }
  return (Enum *)0x0;
}

Assistant:

const reflection::Enum *GetEnumByIndex(int32_t index) const {
    if (!schema_ || index < 0 ||
        index >= static_cast<int32_t>(schema_->enums()->size())) {
      return nullptr;
    }
    return schema_->enums()->Get(index);
  }